

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer *ppMVar1;
  VectorXd *this;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  pointer pMVar7;
  char cVar8;
  int iVar9;
  double *__tmp;
  istream *piVar10;
  pointer pMVar11;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar12;
  ostream *poVar13;
  Scalar *pSVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float px;
  double local_740;
  float local_734;
  float y_gt;
  float x_gt;
  Tools tools;
  float ro;
  longlong timestamp;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  estimations;
  string sensor_type;
  vector<MeasurementPackage,_std::allocator<MeasurementPackage>_> measurement_pack_list;
  float vy_gt;
  float vx_gt;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ground_truth;
  vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_> gt_pack_list;
  string line;
  string out_file_name_;
  MeasurementPackage local_5f8;
  string in_file_name_;
  UKF ukf;
  ofstream out_file_;
  ifstream in_file_;
  
  check_arguments(argc,argv);
  std::__cxx11::string::string((string *)&in_file_name_,argv[1],(allocator *)&in_file_);
  std::ifstream::ifstream(&in_file_,in_file_name_._M_dataplus._M_p,_S_in);
  std::__cxx11::string::string((string *)&out_file_name_,argv[2],(allocator *)&out_file_);
  std::ofstream::ofstream(&out_file_,out_file_name_._M_dataplus._M_p,_S_out);
  check_files(&in_file_,&in_file_name_,&out_file_,&out_file_name_);
  measurement_pack_list.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gt_pack_list.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  measurement_pack_list.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  measurement_pack_list.super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gt_pack_list.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  gt_pack_list.super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  ppMVar1 = &estimations.
             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  lVar17 = 0x10;
  while( true ) {
    piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&in_file_,(string *)&line);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
    sensor_type._M_string_length = 0;
    sensor_type.field_2._M_allocated_capacity =
         sensor_type.field_2._M_allocated_capacity & 0xffffffffffffff00;
    estimations.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ground_truth.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sensor_type._M_dataplus._M_p = (pointer)&sensor_type.field_2;
    std::__cxx11::istringstream::istringstream((istringstream *)&ukf,(string *)&line,_S_in);
    std::operator>>((istream *)&ukf,(string *)&sensor_type);
    iVar9 = std::__cxx11::string::compare((char *)&sensor_type);
    if (iVar9 == 0) {
      estimations.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)estimations.
                            super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      pMVar11 = (pointer)Eigen::internal::aligned_malloc(0x10);
      pMVar7 = estimations.
               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      estimations.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar11;
      free(pMVar7);
      std::istream::_M_extract<float>((float *)&ukf);
      std::istream::_M_extract<float>((float *)&ukf);
      ((estimations.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           (double *)(double)px;
      local_740 = (double)ro;
      tools._vptr_Tools = (_func_int **)ppMVar1;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools,&local_740);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools);
      std::istream::_M_extract<long_long>((longlong *)&ukf);
      estimations.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)timestamp;
      std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                (&measurement_pack_list,(value_type *)&estimations);
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&sensor_type);
      if (iVar9 == 0) {
        estimations.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(estimations.
                               super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,1);
        pMVar11 = (pointer)Eigen::internal::aligned_malloc(0x18);
        pMVar7 = estimations.
                 super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        estimations.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar11;
        free(pMVar7);
        std::istream::_M_extract<float>((float *)&ukf);
        std::istream::_M_extract<float>((float *)&ukf);
        std::istream::_M_extract<float>((float *)&ukf);
        ((estimations.
          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             (double *)(double)ro;
        local_740 = (double)x_gt;
        tools._vptr_Tools = (_func_int **)ppMVar1;
        pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools,
                             &local_740);
        _px = (double)y_gt;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar12,(Scalar *)&px);
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
                  ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools);
        std::istream::_M_extract<long_long>((longlong *)&ukf);
        estimations.
        super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)timestamp;
        std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::push_back
                  (&measurement_pack_list,(value_type *)&estimations);
      }
    }
    std::istream::_M_extract<float>((float *)&ukf);
    std::istream::_M_extract<float>((float *)&ukf);
    std::istream::_M_extract<float>((float *)&ukf);
    std::istream::_M_extract<float>((float *)&ukf);
    pMVar11 = (pointer)Eigen::internal::aligned_malloc(0x20);
    pMVar7 = ground_truth.
             super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ground_truth.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar11;
    free(pMVar7);
    ((ground_truth.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         (double *)(double)x_gt;
    local_740 = (double)y_gt;
    tools._vptr_Tools =
         (_func_int **)
         &ground_truth.
          super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools,
                         &local_740);
    _px = (double)vx_gt;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar12,(Scalar *)&px);
    _ro = (double)vy_gt;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar12,(Scalar *)&ro);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&tools);
    std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::push_back
              (&gt_pack_list,(value_type *)&ground_truth);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ukf);
    free(ground_truth.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    free(estimations.
         super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&sensor_type);
  }
  UKF::UKF(&ukf);
  estimations.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  estimations.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  estimations.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ground_truth.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ground_truth.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ground_truth.
  super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar16 = (long)measurement_pack_list.
                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)measurement_pack_list.
                 super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>._M_impl
                 .super__Vector_impl_data._M_start;
  poVar13 = std::operator<<((ostream *)&out_file_,"px");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"py");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"v");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"yaw_angle");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"yaw_rate");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"px_measured");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"py_measured");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"px_true");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"py_true");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"vx_true");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"vy_true");
  std::operator<<(poVar13,"\t");
  poVar13 = std::operator<<((ostream *)&out_file_,"NIS");
  std::operator<<(poVar13,"\n");
  lVar16 = lVar16 >> 5;
  this = &ukf.x_;
  do {
    bVar18 = lVar16 == 0;
    lVar16 = lVar16 + -1;
    if (bVar18) {
      Tools::Tools(&tools);
      poVar13 = std::operator<<((ostream *)&std::cout,"Accuracy - RMSE:");
      poVar13 = std::endl<char,std::char_traits<char>>(poVar13);
      Tools::CalculateRMSE
                ((Tools *)&sensor_type,
                 (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)&tools,&estimations);
      poVar13 = Eigen::operator<<(poVar13,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                          &sensor_type);
      std::endl<char,std::char_traits<char>>(poVar13);
      free(sensor_type._M_dataplus._M_p);
      cVar8 = std::__basic_file<char>::is_open();
      if (cVar8 != '\0') {
        std::ofstream::close();
      }
      cVar8 = std::__basic_file<char>::is_open();
      if (cVar8 != '\0') {
        std::ifstream::close();
      }
      poVar13 = std::operator<<((ostream *)&std::cout,"Done!");
      std::endl<char,std::char_traits<char>>(poVar13);
      Tools::~Tools(&tools);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&ground_truth);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&estimations);
      UKF::~UKF(&ukf);
      std::__cxx11::string::~string((string *)&line);
      std::vector<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>::~vector(&gt_pack_list);
      std::vector<MeasurementPackage,_std::allocator<MeasurementPackage>_>::~vector
                (&measurement_pack_list);
      std::ofstream::~ofstream(&out_file_);
      std::__cxx11::string::~string((string *)&out_file_name_);
      std::ifstream::~ifstream(&in_file_);
      std::__cxx11::string::~string((string *)&in_file_name_);
      return 0;
    }
    MeasurementPackage::MeasurementPackage
              (&local_5f8,
               (MeasurementPackage *)
               ((long)measurement_pack_list.
                      super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>.
                      _M_impl.super__Vector_impl_data._M_start + lVar17 + -0x10));
    UKF::ProcessMeasurement(&ukf,&local_5f8);
    free(local_5f8.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data);
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,2);
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,3);
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,4);
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    iVar9 = *(int *)((long)measurement_pack_list.
                           super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
    if (iVar9 == 1) {
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           ((long)&(measurement_pack_list.
                                    super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17)
                           ,0);
      dVar2 = *pSVar14;
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           ((long)&(measurement_pack_list.
                                    super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17)
                           ,1);
      local_734 = (float)*pSVar14;
      fVar19 = cosf(local_734);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&out_file_,fVar19 * (float)dVar2);
      std::operator<<(poVar13,"\t");
      fVar19 = sinf(local_734);
      poVar13 = (ostream *)std::ostream::operator<<((ostream *)&out_file_,fVar19 * (float)dVar2);
      std::operator<<(poVar13,"\t");
    }
    else if (iVar9 == 0) {
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           ((long)&(measurement_pack_list.
                                    super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17)
                           ,0);
      poVar13 = std::ostream::_M_insert<double>(*pSVar14);
      std::operator<<(poVar13,"\t");
      pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           ((long)&(measurement_pack_list.
                                    super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17)
                           ,1);
      poVar13 = std::ostream::_M_insert<double>(*pSVar14);
      std::operator<<(poVar13,"\t");
    }
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         ((long)&(gt_pack_list.
                                  super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17),0
                        );
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         ((long)&(gt_pack_list.
                                  super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17),1
                        );
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         ((long)&(gt_pack_list.
                                  super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17),2
                        );
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                         ((long)&(gt_pack_list.
                                  super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17),3
                        );
    poVar13 = std::ostream::_M_insert<double>(*pSVar14);
    std::operator<<(poVar13,"\t");
    iVar9 = *(int *)((long)measurement_pack_list.
                           super__Vector_base<MeasurementPackage,_std::allocator<MeasurementPackage>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8);
    if (iVar9 == 1) {
      poVar13 = std::ostream::_M_insert<double>(ukf.NIS_radar_);
      std::operator<<(poVar13,"\t");
      pcVar15 = "R";
LAB_00110fc1:
      poVar13 = std::operator<<((ostream *)&out_file_,pcVar15);
      std::operator<<(poVar13,"\n");
    }
    else if (iVar9 == 0) {
      poVar13 = std::ostream::_M_insert<double>(ukf.NIS_laser_);
      std::operator<<(poVar13,"\t");
      pcVar15 = "L";
      goto LAB_00110fc1;
    }
    tools._vptr_Tools = (_func_int **)Eigen::internal::aligned_malloc(0x20);
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,0);
    dVar2 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,1);
    local_734 = (float)*pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,2);
    dVar3 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,3);
    dVar5 = cos(*pSVar14);
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,2);
    dVar4 = *pSVar14;
    pSVar14 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this,3);
    dVar6 = sin(*pSVar14);
    sensor_type._M_dataplus._M_p = (pointer)&tools;
    sensor_type._M_string_length = 0;
    sensor_type.field_2._M_allocated_capacity = 1;
    sensor_type.field_2._8_8_ = 1;
    *tools._vptr_Tools = (_func_int *)(double)(float)dVar2;
    timestamp = (longlong)(double)local_734;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&sensor_type,
                         (Scalar *)&timestamp);
    local_740 = (double)(float)(dVar3 * dVar5);
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar12,&local_740);
    _px = (double)(float)(dVar4 * dVar6);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
              (pCVar12,(Scalar *)&px);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer
              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&sensor_type);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&estimations,(value_type *)&tools);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&ground_truth,
                (value_type *)
                ((long)&(gt_pack_list.
                         super__Vector_base<GroundTruthPackage,_std::allocator<GroundTruthPackage>_>
                         ._M_impl.super__Vector_impl_data._M_start)->timestamp_ + lVar17));
    free(tools._vptr_Tools);
    lVar17 = lVar17 + 0x20;
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {

  check_arguments(argc, argv);

  string in_file_name_ = argv[1];
  ifstream in_file_(in_file_name_.c_str(), ifstream::in);

  string out_file_name_ = argv[2];
  ofstream out_file_(out_file_name_.c_str(), ofstream::out);

  check_files(in_file_, in_file_name_, out_file_, out_file_name_);

  /**********************************************
   *  Set Measurements                          *
   **********************************************/

  vector<MeasurementPackage> measurement_pack_list;
  vector<GroundTruthPackage> gt_pack_list;

  string line;

  // prep the measurement packages (each line represents a measurement at a
  // timestamp)
  while (getline(in_file_, line)) {
    string sensor_type;
    MeasurementPackage meas_package;
    GroundTruthPackage gt_package;
    istringstream iss(line);
    long long timestamp;

    // reads first element from the current line
    iss >> sensor_type;

    if (sensor_type.compare("L") == 0) {
      // laser measurement

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::LASER;
      meas_package.raw_measurements_ = VectorXd(2);
      float px;
      float py;
      iss >> px;
      iss >> py;
      meas_package.raw_measurements_ << px, py;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    } else if (sensor_type.compare("R") == 0) {
      // radar measurement

      // read measurements at this timestamp
      meas_package.sensor_type_ = MeasurementPackage::RADAR;
      meas_package.raw_measurements_ = VectorXd(3);
      float ro;
      float phi;
      float ro_dot;
      iss >> ro;
      iss >> phi;
      iss >> ro_dot;
      meas_package.raw_measurements_ << ro, phi, ro_dot;
      iss >> timestamp;
      meas_package.timestamp_ = timestamp;
      measurement_pack_list.push_back(meas_package);
    }

      // read ground truth data to compare later
      float x_gt;
      float y_gt;
      float vx_gt;
      float vy_gt;
      iss >> x_gt;
      iss >> y_gt;
      iss >> vx_gt;
      iss >> vy_gt;
      gt_package.gt_values_ = VectorXd(4);
      gt_package.gt_values_ << x_gt, y_gt, vx_gt, vy_gt;
      gt_pack_list.push_back(gt_package);
  }

  // Create a UKF instance
  UKF ukf;

  // used to compute the RMSE later
  vector<VectorXd> estimations;
  vector<VectorXd> ground_truth;

  // start filtering from the second frame (the speed is unknown in the first
  // frame)

  size_t number_of_measurements = measurement_pack_list.size();

  // column names for output file
  out_file_ << "px" << "\t";
  out_file_ << "py" << "\t";
  out_file_ << "v" << "\t";
  out_file_ << "yaw_angle" << "\t";
  out_file_ << "yaw_rate" << "\t";
  out_file_ << "px_measured" << "\t";
  out_file_ << "py_measured" << "\t";
  out_file_ << "px_true" << "\t";
  out_file_ << "py_true" << "\t";
  out_file_ << "vx_true" << "\t";
  out_file_ << "vy_true" << "\t";
  out_file_ << "NIS" << "\n";


  for (size_t k = 0; k < number_of_measurements; ++k) {
    // Call the UKF-based fusion
    ukf.ProcessMeasurement(measurement_pack_list[k]);

    // output the estimation
    out_file_ << ukf.x_(0) << "\t"; // pos1 - est
    out_file_ << ukf.x_(1) << "\t"; // pos2 - est
    out_file_ << ukf.x_(2) << "\t"; // vel_abs -est
    out_file_ << ukf.x_(3) << "\t"; // yaw_angle -est
    out_file_ << ukf.x_(4) << "\t"; // yaw_rate -est

    // output the measurements
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      // output the estimation

      // p1 - meas
      out_file_ << measurement_pack_list[k].raw_measurements_(0) << "\t";

      // p2 - meas
      out_file_ << measurement_pack_list[k].raw_measurements_(1) << "\t";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      // output the estimation in the cartesian coordinates
      float ro = measurement_pack_list[k].raw_measurements_(0);
      float phi = measurement_pack_list[k].raw_measurements_(1);
      out_file_ << ro * cos(phi) << "\t"; // p1_meas
      out_file_ << ro * sin(phi) << "\t"; // p2_meas
    }

    // output the ground truth packages
    out_file_ << gt_pack_list[k].gt_values_(0) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(1) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(2) << "\t";
    out_file_ << gt_pack_list[k].gt_values_(3) << "\t";

    // output the NIS values
    
    if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::LASER) {
      out_file_ << ukf.NIS_laser_ << "\t";
      out_file_ << "L" << "\n";
    } else if (measurement_pack_list[k].sensor_type_ == MeasurementPackage::RADAR) {
      out_file_ << ukf.NIS_radar_ << "\t";
      out_file_ << "R" << "\n";
    }


    // convert ukf x vector to cartesian to compare to ground truth
    VectorXd ukf_x_cartesian_ = VectorXd(4);

    float x_estimate_ = ukf.x_(0);
    float y_estimate_ = ukf.x_(1);
    float vx_estimate_ = ukf.x_(2) * cos(ukf.x_(3));
    float vy_estimate_ = ukf.x_(2) * sin(ukf.x_(3));
    
    ukf_x_cartesian_ << x_estimate_, y_estimate_, vx_estimate_, vy_estimate_;
    
    estimations.push_back(ukf_x_cartesian_);
    ground_truth.push_back(gt_pack_list[k].gt_values_);

  }

  // compute the accuracy (RMSE)
  Tools tools;
  cout << "Accuracy - RMSE:" << endl << tools.CalculateRMSE(estimations, ground_truth) << endl;

  // close files
  if (out_file_.is_open()) {
    out_file_.close();
  }

  if (in_file_.is_open()) {
    in_file_.close();
  }

  cout << "Done!" << endl;
  return 0;
}